

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O3

int Spatializer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  UnityComplexNumber *pUVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  UnityAudioSpatializerData *pUVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool bVar17;
  void *pvVar18;
  UnityComplexNumber *pUVar19;
  bool bVar20;
  long lVar21;
  float *pfVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  uint uVar26;
  ulong uVar27;
  UnityComplexNumber *data;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float spreadmatrix [2];
  float local_80 [2];
  undefined1 local_78 [16];
  long local_60;
  void *local_58;
  float *local_50;
  uint local_44;
  ulong local_40;
  UnityComplexNumber *local_38;
  
  local_50 = outbuffer;
  if ((((outchannels == 2 && inchannels == 2) && (0x4f < (state->field_0).field_0.structsize)) &&
      (0x102ff < (state->field_0).field_0.hostapiversion)) &&
     (pUVar7 = (state->field_0).field_0.spatializerdata, pUVar7 != (UnityAudioSpatializerData *)0x0)
     ) {
    local_58 = (state->field_0).field_0.effectdata;
    if (local_58 == (void *)0x0) {
      __assert_fail("effectdata",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                    ,0xfd,
                    "T *UnityAudioEffectState::GetEffectData() const [T = Spatializer::EffectData]")
      ;
    }
    if ((state->field_0).field_0.internal == (void *)0x0) {
      __assert_fail("internal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                    ,0xfe,
                    "T *UnityAudioEffectState::GetEffectData() const [T = Spatializer::EffectData]")
      ;
    }
    fVar2 = pUVar7->sourcematrix[0xc];
    fVar3 = pUVar7->sourcematrix[0xd];
    fVar29 = pUVar7->sourcematrix[0xe];
    fVar33 = pUVar7->listenermatrix[8] * fVar29 +
             pUVar7->listenermatrix[0] * fVar2 + pUVar7->listenermatrix[4] * fVar3 +
             pUVar7->listenermatrix[0xc];
    fVar31 = pUVar7->listenermatrix[5];
    fVar30 = pUVar7->listenermatrix[1];
    fVar4 = pUVar7->listenermatrix[9];
    fVar5 = pUVar7->listenermatrix[0xd];
    local_78._0_4_ =
         fVar29 * pUVar7->listenermatrix[10] +
         fVar2 * pUVar7->listenermatrix[2] + fVar3 * pUVar7->listenermatrix[6] +
         pUVar7->listenermatrix[0xe];
    fVar28 = 0.0;
    if (0.001 <= ABS((float)local_78._0_4_)) {
      fVar28 = (float)local_78._0_4_;
      local_78 = ZEXT416((uint)local_78._0_4_);
      fVar28 = atan2f(fVar33,fVar28);
    }
    fVar32 = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar28 |
                    (uint)(fVar28 + 6.2831855) & -(uint)(fVar28 < 0.0)) * 57.295776;
    fVar28 = (float)local_78._0_4_ * (float)local_78._0_4_;
    local_78 = ZEXT416((uint)(((ABS(fVar32) - ABS(fVar32 + -360.0)) + 360.0) * 0.5));
    fVar29 = atan2f(fVar4 * fVar29 + fVar30 * fVar2 + fVar31 * fVar3 + fVar5,
                    SQRT(fVar33 * fVar33 + fVar28) + 0.001);
    pvVar18 = local_58;
    local_60 = CONCAT44(local_60._4_4_,fVar29 * 57.295776);
    pUVar7 = (state->field_0).field_0.spatializerdata;
    fVar2 = pUVar7->spatialblend;
    fVar3 = pUVar7->reverbzonemix;
    local_38 = (UnityComplexNumber *)((long)local_58 + 0xc);
    uVar27 = 0;
    GetHRTF(0,local_38,(float)local_78._0_4_,fVar29 * 57.295776);
    GetHRTF(1,(UnityComplexNumber *)((long)pvVar18 + 0x700c),(float)local_78._0_4_,(float)local_60);
    local_80[1] = cosf((((state->field_0).field_0.spatializerdata)->spread * 3.1415927) / 360.0);
    local_80[0] = 2.0 - local_80[1];
    if (length != 0) {
      local_60 = (long)local_58 + 0x680c;
      pfVar25 = reverbmixbuffer;
      local_44 = length;
      do {
        local_40 = uVar27;
        pfVar22 = local_80;
        uVar27 = 0;
        bVar20 = true;
        do {
          bVar17 = bVar20;
          pUVar19 = local_38;
          fVar29 = ((state->field_0).field_0.spatializerdata)->stereopan;
          fVar30 = fVar29;
          fVar31 = -fVar29;
          if (!bVar17) {
            fVar30 = -fVar29;
            fVar31 = fVar29;
          }
          local_78 = ZEXT416((uint)((ABS(fVar31 + 0.0) + fVar30 + 0.0) * 0.5));
          lVar21 = uVar27 * 0x7000;
          fVar29 = *pfVar22;
          fVar31 = local_80[uVar27 ^ 1];
          lVar23 = local_60 + lVar21;
          lVar24 = 0;
          do {
            fVar30 = inbuffer[lVar24 * 2 + 1];
            fVar4 = inbuffer[lVar24 * 2];
            *(undefined4 *)(lVar23 + -0x800 + lVar24 * 4) = *(undefined4 *)(lVar23 + lVar24 * 4);
            *(float *)(lVar23 + lVar24 * 4) = fVar4 * fVar29 + fVar30 * fVar31;
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x200);
          lVar23 = 0x1803;
          do {
            uVar6 = *(ulong *)((long)local_58 + lVar23 * 4 + lVar21);
            auVar8._8_4_ = (int)(uVar6 >> 0x20);
            auVar8._0_8_ = uVar6 & 0xffffffff;
            auVar8._12_4_ = 0;
            *(undefined1 (*) [16])((long)local_58 + lVar23 * 8 + lVar21 + -0xa00c) = auVar8;
            lVar23 = lVar23 + 2;
          } while (lVar23 != 0x1c03);
          FFT::Forward(local_38 + uVar27 * 0xe00 + 0x400,0x400,false);
          data = pUVar19 + uVar27 * 0xe00 + 0x800;
          lVar21 = -0x400;
          do {
            pUVar1 = pUVar19 + uVar27 * 0xe00 + lVar21 + 0x802;
            fVar29 = pUVar1->re;
            fVar31 = pUVar1->im;
            fVar30 = pUVar1[1].re;
            fVar4 = pUVar1[1].im;
            pUVar1 = data + lVar21;
            fVar5 = pUVar1->re;
            fVar28 = pUVar1->im;
            fVar33 = pUVar1[1].re;
            fVar32 = pUVar1[1].im;
            pUVar1 = pUVar19 + uVar27 * 0xe00 + lVar21 + 0x400;
            fVar9 = pUVar1->re;
            fVar10 = pUVar1->im;
            fVar11 = pUVar1[1].re;
            fVar12 = pUVar1[1].im;
            pUVar1 = pUVar19 + uVar27 * 0xe00 + lVar21 + 0x402;
            fVar13 = pUVar1->re;
            fVar14 = pUVar1->im;
            fVar15 = pUVar1[1].re;
            fVar16 = pUVar1[1].im;
            pUVar1 = pUVar19 + uVar27 * 0xe00 + lVar21 + 0xc02;
            pUVar1->re = fVar13 * fVar29 - fVar14 * fVar31;
            pUVar1->im = fVar29 * fVar14 + fVar31 * fVar13;
            pUVar1[1].re = fVar15 * fVar30 - fVar16 * fVar4;
            pUVar1[1].im = fVar30 * fVar16 + fVar4 * fVar15;
            pUVar1 = pUVar19 + uVar27 * 0xe00 + lVar21 + 0xc00;
            pUVar1->re = fVar9 * fVar5 - fVar10 * fVar28;
            pUVar1->im = fVar5 * fVar10 + fVar28 * fVar9;
            pUVar1[1].re = fVar11 * fVar33 - fVar12 * fVar32;
            pUVar1[1].im = fVar33 * fVar12 + fVar32 * fVar11;
            lVar21 = lVar21 + 4;
          } while (lVar21 != 0);
          local_78._0_4_ = 1.0 - (float)local_78._0_4_;
          FFT::Backward(data,0x400,false);
          lVar21 = 0;
          do {
            fVar31 = *(float *)((long)inbuffer + lVar21 + uVar27 * 4) * (float)local_78._0_4_;
            fVar29 = *(float *)((long)&data->re + lVar21);
            fVar31 = ((fVar29 + fVar29) - fVar31) * fVar2 + fVar31;
            *(float *)((long)local_50 + lVar21 + uVar27 * 4) = fVar31;
            *(float *)((long)pfVar25 + lVar21 + uVar27 * 4) =
                 fVar31 * fVar3 + *(float *)((long)pfVar25 + lVar21 + uVar27 * 4);
            lVar21 = lVar21 + 8;
          } while (lVar21 != 0x1000);
          uVar27 = 1;
          pfVar22 = local_80 + 1;
          bVar20 = false;
        } while (bVar17);
        inbuffer = inbuffer + 0x400;
        local_50 = local_50 + 0x400;
        pfVar25 = pfVar25 + 0x400;
        uVar26 = (int)local_40 + 0x200;
        uVar27 = (ulong)uVar26;
      } while (uVar26 < local_44);
    }
  }
  else {
    memcpy(outbuffer,inbuffer,(ulong)(outchannels * length) << 2);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        // Check that I/O formats are right and that the host API supports this feature
        if (inchannels != 2 || outchannels != 2 ||
            !IsHostCompatible(state) || state->spatializerdata == NULL)
        {
            memcpy(outbuffer, inbuffer, length * outchannels * sizeof(float));
            return UNITY_AUDIODSP_OK;
        }

        EffectData* data = state->GetEffectData<EffectData>();

        static const float kRad2Deg = 180.0f / kPI;

        float* m = state->spatializerdata->listenermatrix;
        float* s = state->spatializerdata->sourcematrix;

        // Currently we ignore source orientation and only use the position
        float px = s[12];
        float py = s[13];
        float pz = s[14];

        float dir_x = m[0] * px + m[4] * py + m[8] * pz + m[12];
        float dir_y = m[1] * px + m[5] * py + m[9] * pz + m[13];
        float dir_z = m[2] * px + m[6] * py + m[10] * pz + m[14];

        float azimuth = (fabsf(dir_z) < 0.001f) ? 0.0f : atan2f(dir_x, dir_z);
        if (azimuth < 0.0f)
            azimuth += 2.0f * kPI;
        azimuth = FastClip(azimuth * kRad2Deg, 0.0f, 360.0f);

        float elevation = atan2f(dir_y, sqrtf(dir_x * dir_x + dir_z * dir_z) + 0.001f) * kRad2Deg;
        float spatialblend = state->spatializerdata->spatialblend;
        float reverbmix = state->spatializerdata->reverbzonemix;

        GetHRTF(0, data->ch[0].h, azimuth, elevation);
        GetHRTF(1, data->ch[1].h, azimuth, elevation);

        // From the FMOD documentation:
        //   A spread angle of 0 makes the stereo sound mono at the point of the 3D emitter.
        //   A spread angle of 90 makes the left part of the stereo sound place itself at 45 degrees to the left and the right part 45 degrees to the right.
        //   A spread angle of 180 makes the left part of the stero sound place itself at 90 degrees to the left and the right part 90 degrees to the right.
        //   A spread angle of 360 makes the stereo sound mono at the opposite speaker location to where the 3D emitter should be located (by moving the left part 180 degrees left and the right part 180 degrees right). So in this case, behind you when the sound should be in front of you!
        // Note that FMOD performs the spreading and panning in one go. We can't do this here due to the way that impulse-based spatialization works, so we perform the spread calculations on the left/right source signals before they enter the convolution processing.
        // That way we can still use it to control how the source signal downmixing takes place.
        float spread = cosf(state->spatializerdata->spread * kPI / 360.0f);
        float spreadmatrix[2] = { 2.0f - spread, spread };

        float* reverb = reverbmixbuffer;
        for (int sampleOffset = 0; sampleOffset < length; sampleOffset += HRTFLEN)
        {
            for (int c = 0; c < 2; c++)
            {
                // stereopan is in the [-1; 1] range, this acts the way fmod does it for stereo
                float stereopan = 1.0f - ((c == 0) ? FastMax(0.0f, state->spatializerdata->stereopan) : FastMax(0.0f, -state->spatializerdata->stereopan));

                InstanceChannel& ch = data->ch[c];

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float left  = inbuffer[n * 2];
                    float right = inbuffer[n * 2 + 1];
                    ch.buffer[n] = ch.buffer[n + HRTFLEN];
                    ch.buffer[n + HRTFLEN] = left * spreadmatrix[c] + right * spreadmatrix[1 - c];
                }

                for (int n = 0; n < HRTFLEN * 2; n++)
                {
                    ch.x[n].re = ch.buffer[n];
                    ch.x[n].im = 0.0f;
                }

                FFT::Forward(ch.x, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN * 2; n++)
                    UnityComplexNumber::Mul<float, float, float>(ch.x[n], ch.h[n], ch.y[n]);

                FFT::Backward(ch.y, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float s = inbuffer[n * 2 + c] * stereopan;
                    float y = s + (ch.y[n].re * GAINCORRECTION - s) * spatialblend;
                    outbuffer[n * 2 + c] = y;
                    reverb[n * 2 + c] += y * reverbmix;
                }
            }

            inbuffer += HRTFLEN * 2;
            outbuffer += HRTFLEN * 2;
            reverb += HRTFLEN * 2;
        }

        return UNITY_AUDIODSP_OK;
    }